

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

CivilInfo * __thiscall
absl::lts_20240722::TimeZone::At(CivilInfo *__return_storage_ptr__,TimeZone *this,Time t)

{
  uint32_t uVar1;
  undefined4 uVar2;
  fields fVar3;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  absolute_lookup al;
  int_least64_t local_40 [2];
  int local_30;
  bool local_2c;
  char *local_28;
  
  uVar1 = t.rep_.rep_lo_;
  if (uVar1 == 0xffffffff && t.rep_.rep_hi_ == (HiRep)0x7fffffffffffffff) {
    CivilInfo::CivilInfo(__return_storage_ptr__);
    fVar3 = (fields)time_internal::cctz::detail::
                    civil_time<absl::lts_20240722::time_internal::second_tag>::max();
    (__return_storage_ptr__->cs).f_ = fVar3;
    (__return_storage_ptr__->subsecond).rep_hi_.lo_ = 0xffffffff;
    (__return_storage_ptr__->subsecond).rep_hi_.hi_ = 0x7fffffff;
  }
  else {
    if (t.rep_.rep_hi_ != (HiRep)0x8000000000000000 || uVar1 != 0xffffffff) {
      absl::lts_20240722::time_internal::cctz::time_zone::lookup((time_point *)local_40);
      CivilInfo::CivilInfo(__return_storage_ptr__);
      (__return_storage_ptr__->cs).f_.y = local_40[0];
      uVar2 = (undefined4)local_40[1];
      (__return_storage_ptr__->cs).f_.m = (char)uVar2;
      (__return_storage_ptr__->cs).f_.d = (char)((uint)uVar2 >> 8);
      (__return_storage_ptr__->cs).f_.hh = (char)((uint)uVar2 >> 0x10);
      (__return_storage_ptr__->cs).f_.mm = (char)((uint)uVar2 >> 0x18);
      (__return_storage_ptr__->cs).f_.ss = (int_least8_t)((ulong)local_40[1] >> 0x20);
      (__return_storage_ptr__->subsecond).rep_hi_.lo_ = 0;
      (__return_storage_ptr__->subsecond).rep_hi_.hi_ = 0;
      (__return_storage_ptr__->subsecond).rep_lo_ = uVar1;
      __return_storage_ptr__->offset = local_30;
      __return_storage_ptr__->is_dst = local_2c;
      goto LAB_0010bafa;
    }
    CivilInfo::CivilInfo(__return_storage_ptr__);
    (__return_storage_ptr__->cs).f_.y = -0x8000000000000000;
    (__return_storage_ptr__->cs).f_.m = '\x01';
    (__return_storage_ptr__->cs).f_.d = '\x01';
    (__return_storage_ptr__->cs).f_.hh = '\0';
    (__return_storage_ptr__->cs).f_.mm = '\0';
    (__return_storage_ptr__->cs).f_.ss = '\0';
    *(undefined3 *)&(__return_storage_ptr__->cs).f_.field_0xd = 0;
    (__return_storage_ptr__->subsecond).rep_hi_.lo_ = 0;
    (__return_storage_ptr__->subsecond).rep_hi_.hi_ = 0x80000000;
  }
  *(undefined8 *)&(__return_storage_ptr__->subsecond).rep_lo_ = 0xffffffff;
  __return_storage_ptr__->is_dst = false;
  local_28 = "-00";
LAB_0010bafa:
  __return_storage_ptr__->zone_abbr = local_28;
  return __return_storage_ptr__;
}

Assistant:

absl::TimeZone::CivilInfo TimeZone::At(Time t) const {
  if (t == absl::InfiniteFuture()) return InfiniteFutureCivilInfo();
  if (t == absl::InfinitePast()) return InfinitePastCivilInfo();

  const auto ud = time_internal::ToUnixDuration(t);
  const auto tp = unix_epoch() + cctz::seconds(time_internal::GetRepHi(ud));
  const auto al = cz_.lookup(tp);

  TimeZone::CivilInfo ci;
  ci.cs = CivilSecond(al.cs);
  ci.subsecond = time_internal::MakeDuration(0, time_internal::GetRepLo(ud));
  ci.offset = al.offset;
  ci.is_dst = al.is_dst;
  ci.zone_abbr = al.abbr;
  return ci;
}